

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int read_times(FILE *statfile_fp,uint numcpus,uv_cpu_info_t *ci)

{
  int iVar1;
  char *pcVar2;
  uint local_49c;
  int r;
  uint n;
  char buf [1024];
  long local_90;
  uint64_t len;
  uint64_t num;
  uint64_t irq;
  uint64_t dummy;
  uint64_t idle;
  uint64_t sys;
  uint64_t nice;
  uint64_t user;
  uint64_t clock_ticks;
  uv_cpu_times_s ts;
  uv_cpu_info_t *ci_local;
  uint numcpus_local;
  FILE *statfile_fp_local;
  
  ts.irq = (uint64_t)ci;
  user = sysconf(2);
  if (user == 0xffffffffffffffff) {
    __assert_fail("clock_ticks != (uint64_t) -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/linux-core.c"
                  ,0x30f,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
  }
  if (user != 0) {
    rewind((FILE *)statfile_fp);
    pcVar2 = fgets((char *)&r,0x400,(FILE *)statfile_fp);
    if (pcVar2 == (char *)0x0) {
      abort();
    }
    len = 0;
    while( true ) {
      pcVar2 = fgets((char *)&r,0x400,(FILE *)statfile_fp);
      if (((pcVar2 == (char *)0x0) || (numcpus <= len)) ||
         (iVar1 = strncmp((char *)&r,"cpu",3), iVar1 != 0)) {
        if (len != numcpus) {
          __assert_fail("num == numcpus",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/linux-core.c"
                        ,0x341,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        return 0;
      }
      iVar1 = sscanf((char *)&r,"cpu%u ",&local_49c);
      if (iVar1 != 1) {
        __assert_fail("r == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/linux-core.c"
                      ,0x324,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
      }
      local_90 = 5;
      while (local_49c = local_49c / 10, local_49c != 0) {
        local_90 = local_90 + 1;
      }
      iVar1 = sscanf((char *)((long)&r + local_90),"%lu %lu %lu%lu %lu %lu",&nice,&sys,&idle,&dummy,
                     &irq,&num);
      if (iVar1 != 6) break;
      clock_ticks = user * nice;
      ts.user = user * sys;
      ts.nice = user * idle;
      ts.sys = user * dummy;
      ts.idle = user * num;
      memcpy((void *)(ts.irq + len * 0x38 + 0x10),&clock_ticks,0x28);
      len = len + 1;
    }
    abort();
  }
  __assert_fail("clock_ticks != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/linux-core.c"
                ,0x310,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
}

Assistant:

static int read_times(FILE* statfile_fp,
                      unsigned int numcpus,
                      uv_cpu_info_t* ci) {
  struct uv_cpu_times_s ts;
  uint64_t clock_ticks;
  uint64_t user;
  uint64_t nice;
  uint64_t sys;
  uint64_t idle;
  uint64_t dummy;
  uint64_t irq;
  uint64_t num;
  uint64_t len;
  char buf[1024];

  clock_ticks = sysconf(_SC_CLK_TCK);
  assert(clock_ticks != (uint64_t) -1);
  assert(clock_ticks != 0);

  rewind(statfile_fp);

  if (!fgets(buf, sizeof(buf), statfile_fp))
    abort();

  num = 0;

  while (fgets(buf, sizeof(buf), statfile_fp)) {
    if (num >= numcpus)
      break;

    if (strncmp(buf, "cpu", 3))
      break;

    /* skip "cpu<num> " marker */
    {
      unsigned int n;
      int r = sscanf(buf, "cpu%u ", &n);
      assert(r == 1);
      (void) r;  /* silence build warning */
      for (len = sizeof("cpu0"); n /= 10; len++);
    }

    /* Line contains user, nice, system, idle, iowait, irq, softirq, steal,
     * guest, guest_nice but we're only interested in the first four + irq.
     *
     * Don't use %*s to skip fields or %ll to read straight into the uint64_t
     * fields, they're not allowed in C89 mode.
     */
    if (6 != sscanf(buf + len,
                    "%" PRIu64 " %" PRIu64 " %" PRIu64
                    "%" PRIu64 " %" PRIu64 " %" PRIu64,
                    &user,
                    &nice,
                    &sys,
                    &idle,
                    &dummy,
                    &irq))
      abort();

    ts.user = clock_ticks * user;
    ts.nice = clock_ticks * nice;
    ts.sys  = clock_ticks * sys;
    ts.idle = clock_ticks * idle;
    ts.irq  = clock_ticks * irq;
    ci[num++].cpu_times = ts;
  }
  assert(num == numcpus);

  return 0;
}